

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_ShmtWriter.cpp
# Opt level: O0

void axl::io::ShmtWriter::copyWriteChain
               (void *_pDst,void **blockArray,size_t *sizeArray,size_t count)

{
  void *in_RCX;
  long in_RDX;
  long in_RSI;
  size_t size;
  void *src;
  size_t i;
  char *dst;
  void *dst_00;
  
  for (dst_00 = (void *)0x0; dst_00 < in_RCX; dst_00 = (void *)((long)dst_00 + 1)) {
    __wrap_memcpy(dst_00,*(void **)(in_RSI + (long)dst_00 * 8),
                  *(size_t *)(in_RDX + (long)dst_00 * 8));
  }
  return;
}

Assistant:

void
ShmtWriter::copyWriteChain(
	void* _pDst,
	const void* const* blockArray,
	const size_t* sizeArray,
	size_t count
) {
	char* dst = (char*)_pDst;

	for (size_t i = 0; i < count; i++) {
		const void* src = blockArray[i];
		size_t size = sizeArray[i];

		memcpy(dst, src, size);
		dst += size;
	}
}